

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
          (BindDirectiveSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token bind,NameSyntax *target,BindTargetListSyntax *targetInstances,
          HierarchyInstantiationSyntax *instantiation)

{
  NameSyntax *pNVar1;
  HierarchyInstantiationSyntax *pHVar2;
  HierarchyInstantiationSyntax *local_48;
  BindTargetListSyntax *local_40;
  BindTargetListSyntax *local_38;
  BindTargetListSyntax *targetInstances_local;
  NameSyntax *target_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  BindDirectiveSyntax *this_local;
  Token bind_local;
  
  bind_local._0_8_ = bind.info;
  this_local = bind._0_8_;
  local_38 = targetInstances;
  targetInstances_local = (BindTargetListSyntax *)target;
  target_local = (NameSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,BindDirective,attributes);
  *(BindDirectiveSyntax **)&this->bind = this_local;
  (this->bind).info = (Info *)bind_local._0_8_;
  local_40 = targetInstances_local;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->target,(NameSyntax **)&local_40);
  this->targetInstances = local_38;
  local_48 = instantiation;
  not_null<slang::syntax::HierarchyInstantiationSyntax*>::
  not_null<slang::syntax::HierarchyInstantiationSyntax*,void>
            ((not_null<slang::syntax::HierarchyInstantiationSyntax*> *)&this->instantiation,
             &local_48);
  pNVar1 = not_null<slang::syntax::NameSyntax_*>::operator->(&this->target);
  (pNVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->targetInstances != (BindTargetListSyntax *)0x0) {
    (this->targetInstances->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pHVar2 = not_null<slang::syntax::HierarchyInstantiationSyntax_*>::operator->(&this->instantiation)
  ;
  (pHVar2->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

BindDirectiveSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token bind, NameSyntax& target, BindTargetListSyntax* targetInstances, HierarchyInstantiationSyntax& instantiation) :
        MemberSyntax(SyntaxKind::BindDirective, attributes), bind(bind), target(&target), targetInstances(targetInstances), instantiation(&instantiation) {
        this->target->parent = this;
        if (this->targetInstances) this->targetInstances->parent = this;
        this->instantiation->parent = this;
    }